

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

int Au_NtkCreateFan(Au_Ntk_t *pNtk,int iFanin,int iFanout,int iModel)

{
  int h;
  Au_Obj_t *p_00;
  Au_Obj_t *p;
  int Id;
  int iModel_local;
  int iFanout_local;
  int iFanin_local;
  Au_Ntk_t *pNtk_local;
  
  h = Au_NtkAllocObj(pNtk,1,4);
  p_00 = Au_NtkObj(pNtk,h);
  if (iFanin != 0) {
    Au_ObjSetFaninLit(p_00,0,iFanin);
  }
  Au_ObjSetFaninLit(p_00,1,iFanout);
  *(ulong *)p_00 = *(ulong *)p_00 & 0xffffffffc0000000 | (ulong)(uint)iModel & 0x3fffffff;
  return h;
}

Assistant:

int Au_NtkCreateFan( Au_Ntk_t * pNtk, int iFanin, int iFanout, int iModel )
{
    int Id = Au_NtkAllocObj( pNtk, 1, AU_OBJ_FAN );
    Au_Obj_t * p = Au_NtkObj( pNtk, Id );
    if ( iFanin )
        Au_ObjSetFaninLit( p, 0, iFanin );
    Au_ObjSetFaninLit( p, 1, iFanout );
    p->Func = iModel;
    return Id;
}